

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *
remap_pls(vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
          *__return_storage_ptr__,SmallVector<PLSArg,_8UL> *pls_variables,
         SmallVector<spirv_cross::Resource,_8UL> *resources,
         SmallVector<spirv_cross::Resource,_8UL> *secondary_resources)

{
  string *__rhs;
  Resource *pRVar1;
  __type _Var2;
  long lVar3;
  string *psVar4;
  PLSArg *pPVar5;
  PlsRemap local_48;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *local_40;
  PLSArg *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar5 = (pls_variables->super_VectorView<PLSArg>).ptr;
  local_38 = pPVar5 + (pls_variables->super_VectorView<PLSArg>).buffer_size;
  local_40 = __return_storage_ptr__;
  do {
    if (pPVar5 == local_38) {
      return local_40;
    }
    pRVar1 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
    __rhs = &pPVar5->name;
    for (lVar3 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size * 0x30;
        psVar4 = &pRVar1->name, lVar3 != 0; lVar3 = lVar3 + -0x30) {
      _Var2 = std::operator==(psVar4,__rhs);
      if (_Var2) {
        local_48.id = *(uint32_t *)((long)(psVar4 + -1) + 0x10);
        local_48.format = pPVar5->format;
        std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
        emplace_back<spirv_cross::PlsRemap>(local_40,&local_48);
        goto LAB_0011236a;
      }
      pRVar1 = (Resource *)(psVar4 + 1);
    }
    if (secondary_resources != (SmallVector<spirv_cross::Resource,_8UL> *)0x0) {
      pRVar1 = (secondary_resources->super_VectorView<spirv_cross::Resource>).ptr;
      for (lVar3 = (secondary_resources->super_VectorView<spirv_cross::Resource>).buffer_size * 0x30
          ; psVar4 = &pRVar1->name, lVar3 != 0; lVar3 = lVar3 + -0x30) {
        _Var2 = std::operator==(psVar4,__rhs);
        if (_Var2) {
          local_48.id = *(uint32_t *)((long)(psVar4 + -1) + 0x10);
          local_48.format = pPVar5->format;
          std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
          emplace_back<spirv_cross::PlsRemap>(local_40,&local_48);
          goto LAB_0011236a;
        }
        pRVar1 = (Resource *)(psVar4 + 1);
      }
    }
    fprintf(_stderr,"Did not find stage input/output/target with name \"%s\".\n",
            (__rhs->_M_dataplus)._M_p);
LAB_0011236a:
    pPVar5 = pPVar5 + 1;
  } while( true );
}

Assistant:

static vector<PlsRemap> remap_pls(const SmallVector<PLSArg> &pls_variables, const SmallVector<Resource> &resources,
                                  const SmallVector<Resource> *secondary_resources)
{
	vector<PlsRemap> ret;

	for (auto &pls : pls_variables)
	{
		bool found = false;
		for (auto &res : resources)
		{
			if (res.name == pls.name)
			{
				ret.push_back({ res.id, pls.format });
				found = true;
				break;
			}
		}

		if (!found && secondary_resources)
		{
			for (auto &res : *secondary_resources)
			{
				if (res.name == pls.name)
				{
					ret.push_back({ res.id, pls.format });
					found = true;
					break;
				}
			}
		}

		if (!found)
			fprintf(stderr, "Did not find stage input/output/target with name \"%s\".\n", pls.name.c_str());
	}

	return ret;
}